

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::commitSaturation(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  
  MVar1 = mmal_port_parameter_set_rational
                    (((this->State).camera_component)->control,0x1002f,
                     (MMAL_RATIONAL_T)((ulong)(uint)(this->State).saturation | 0x6400000000));
  if (MVar1 != MMAL_SUCCESS) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"commitSaturation",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set saturation parameter.\n",0x26);
    return;
  }
  return;
}

Assistant:

void Private_Impl::commitSaturation() {
            if ( mmal_port_parameter_set_rational ( State.camera_component->control, MMAL_PARAMETER_SATURATION, ( MMAL_RATIONAL_T ) {
            State.saturation, 100
        } ) != MMAL_SUCCESS )
            cout << __func__ << ": Failed to set saturation parameter.\n";
        }